

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O1

void CB::print_update(vw *all,bool is_test,example *ec,multi_ex *ec_seq,bool action_scores)

{
  float fVar1;
  bool holdout_set_off;
  uint32_t prediction;
  shared_data *psVar2;
  pointer ppeVar3;
  example *peVar4;
  wclass *pwVar5;
  size_t current_pass;
  char cVar6;
  ostream *poVar7;
  ostringstream *this;
  long lVar8;
  char *pcVar9;
  long lVar10;
  size_t num_features;
  string label_buf;
  ostringstream pred_buf;
  string local_1e8;
  string local_1c8;
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  psVar2 = all->sd;
  if ((((double)psVar2->dump_interval <=
        psVar2->weighted_labeled_examples + psVar2->weighted_unlabeled_examples) &&
      (all->quiet == false)) && (all->bfgs == false)) {
    if (ec_seq == (multi_ex *)0x0) {
      num_features = ec->num_features;
    }
    else {
      ppeVar3 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar8 = (long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppeVar3;
      if (lVar8 == 0) {
        num_features = 0;
      }
      else {
        lVar8 = lVar8 >> 3;
        num_features = 0;
        lVar10 = 0;
        do {
          peVar4 = ppeVar3[lVar10];
          pwVar5 = (peVar4->l).cs.costs._begin;
          if ((((long)(peVar4->l).cs.costs._end - (long)pwVar5 != 0x10) ||
              (fVar1 = pwVar5->partial_prediction, fVar1 != -1.0)) || (NAN(fVar1))) {
            num_features = num_features + peVar4->num_features;
          }
          lVar10 = lVar10 + 1;
        } while (lVar8 + (ulong)(lVar8 == 0) != lVar10);
      }
    }
    prediction = (ec->pred).multiclass;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    pcVar9 = " known";
    if (is_test) {
      pcVar9 = " unknown";
    }
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,(ulong)pcVar9);
    if (action_scores) {
      this = (ostringstream *)local_1a8;
      std::__cxx11::ostringstream::ostringstream(this);
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 8;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x80;
      lVar8 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar8 + 1] == '\0') {
        cVar6 = std::ios::widen((char)&stack0xfffffffffffffe08 + (char)lVar8 + 'P');
        acStack_c8[lVar8] = cVar6;
        acStack_c8[lVar8 + 1] = '\x01';
      }
      acStack_c8[lVar8] = ' ';
      if ((ec->pred).scalars._end == (ec->pred).scalars._begin) {
        lVar8 = 9;
        pcVar9 = "no action";
      }
      else {
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
        this = (ostringstream *)
               std::ostream::_M_insert<double>((double)((ec->pred).a_s._begin)->score);
        lVar8 = 3;
        pcVar9 = "...";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar9,lVar8);
      psVar2 = all->sd;
      current_pass = all->current_pass;
      holdout_set_off = all->holdout_set_off;
      std::__cxx11::stringbuf::str();
      shared_data::print_update
                (psVar2,holdout_set_off,current_pass,&local_1e8,&local_1c8,num_features,
                 all->progress_add,all->progress_arg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    else {
      shared_data::print_update
                (all->sd,all->holdout_set_off,all->current_pass,&local_1e8,prediction,num_features,
                 all->progress_add,all->progress_arg);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec, multi_ex* ec_seq, bool action_scores)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    size_t num_features = ec.num_features;

    size_t pred = ec.pred.multiclass;
    if (ec_seq != nullptr)
    {
      num_features = 0;
      // TODO: code duplication csoaa.cc LabelDict::ec_is_example_header
      for (size_t i = 0; i < (*ec_seq).size(); i++)
        if (!CB::ec_is_example_header(*(*ec_seq)[i]))
          num_features += (*ec_seq)[i]->num_features;
    }
    std::string label_buf;
    if (is_test)
      label_buf = " unknown";
    else
      label_buf = " known";

    if (action_scores)
    {
      std::ostringstream pred_buf;
      pred_buf << std::setw(all.sd->col_current_predict) << std::right << std::setfill(' ');
      if (ec.pred.a_s.size() > 0)
        pred_buf << ec.pred.a_s[0].action << ":" << ec.pred.a_s[0].score << "...";
      else
        pred_buf << "no action";
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, pred_buf.str(), num_features,
          all.progress_add, all.progress_arg);
    }
    else
      all.sd->print_update(all.holdout_set_off, all.current_pass, label_buf, (uint32_t)pred, num_features,
          all.progress_add, all.progress_arg);
  }
}